

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O0

int testInvalidBranchOutputNotProduced2(void)

{
  ModelDescription *pMVar1;
  FeatureDescription *this;
  FeatureType *pFVar2;
  ArrayFeatureType *this_00;
  NeuralNetworkLayer *pNVar3;
  ActivationParams *pAVar4;
  NeuralNetwork *pNVar5;
  ostream *poVar6;
  undefined1 local_110 [8];
  Result res;
  BranchLayerParams *branch_layer;
  NeuralNetworkLayer *l4;
  NeuralNetworkLayer *l3;
  NeuralNetwork *nnMain;
  NeuralNetworkLayer *l1;
  NeuralNetwork nnIf;
  FeatureDescription *out;
  ArrayFeatureType *shape;
  FeatureDescription *topIn;
  Model m;
  
  CoreML::Specification::Model::Model((Model *)&topIn);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  this = CoreML::Specification::ModelDescription::add_input(pMVar1);
  CoreML::Specification::FeatureDescription::set_name(this,"A");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(this);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type(this);
  this_00 = CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::ArrayFeatureType::add_shape(this_00,1);
  pMVar1 = CoreML::Specification::Model::mutable_description((Model *)&topIn);
  nnIf._80_8_ = CoreML::Specification::ModelDescription::add_output(pMVar1);
  CoreML::Specification::FeatureDescription::set_name((FeatureDescription *)nnIf._80_8_,"B");
  pFVar2 = CoreML::Specification::FeatureDescription::mutable_type
                     ((FeatureDescription *)nnIf._80_8_);
  CoreML::Specification::FeatureType::mutable_multiarraytype(pFVar2);
  CoreML::Specification::NeuralNetwork::NeuralNetwork((NeuralNetwork *)&l1);
  pNVar3 = CoreML::Specification::NeuralNetwork::add_layers((NeuralNetwork *)&l1);
  pAVar4 = CoreML::Specification::NeuralNetworkLayer::mutable_activation(pNVar3);
  CoreML::Specification::ActivationParams::mutable_relu(pAVar4);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar3,"if_relu");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar3,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar3,"B");
  pNVar5 = CoreML::Specification::Model::mutable_neuralnetwork((Model *)&topIn);
  CoreML::Specification::NeuralNetwork::set_arrayinputshapemapping(pNVar5,EXACT_ARRAY_MAPPING);
  pNVar3 = CoreML::Specification::NeuralNetwork::add_layers(pNVar5);
  pAVar4 = CoreML::Specification::NeuralNetworkLayer::mutable_activation(pNVar3);
  CoreML::Specification::ActivationParams::mutable_relu(pAVar4);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar3,"condition_producing_layer");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar3,"A");
  CoreML::Specification::NeuralNetworkLayer::add_output(pNVar3,"cond");
  pNVar3 = CoreML::Specification::NeuralNetwork::add_layers(pNVar5);
  res.m_message.field_2._8_8_ = CoreML::Specification::NeuralNetworkLayer::mutable_branch(pNVar3);
  CoreML::Specification::NeuralNetworkLayer::set_name(pNVar3,"branch_layer");
  CoreML::Specification::NeuralNetworkLayer::add_input(pNVar3,"cond");
  pNVar5 = CoreML::Specification::BranchLayerParams::mutable_ifbranch
                     ((BranchLayerParams *)res.m_message.field_2._8_8_);
  CoreML::Specification::NeuralNetwork::CopyFrom(pNVar5,(NeuralNetwork *)&l1);
  CoreML::validate<(MLModelType)500>((Result *)local_110,(Model *)&topIn);
  m._oneof_case_[0]._0_1_ = CoreML::Result::good((Result *)local_110);
  if (m._oneof_case_[0]._0_1_) {
    poVar6 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                            );
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,0x113f);
    poVar6 = std::operator<<(poVar6,": error: ");
    poVar6 = std::operator<<(poVar6,"!((res).good())");
    poVar6 = std::operator<<(poVar6," was false, expected true.");
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
  }
  m._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result((Result *)local_110);
  CoreML::Specification::NeuralNetwork::~NeuralNetwork((NeuralNetwork *)&l1);
  CoreML::Specification::Model::~Model((Model *)&topIn);
  return m._oneof_case_[0];
}

Assistant:

int testInvalidBranchOutputNotProduced2() {
    Specification::Model m;
    auto *topIn = m.mutable_description()->add_input();
    topIn->set_name("A");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);
    
    auto *out = m.mutable_description()->add_output();
    out->set_name("B");
    out->mutable_type()->mutable_multiarraytype();
    
    // "If" net
    Specification::NeuralNetwork nnIf;
    auto *l1 = nnIf.add_layers();
    (void)l1->mutable_activation()->mutable_relu();
    l1->set_name("if_relu");
    l1->add_input("A");
    l1->add_output("B");
    
    // Main network
    auto *nnMain = m.mutable_neuralnetwork();
    nnMain->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);
    auto *l3 = nnMain->add_layers();
    (void)l3->mutable_activation()->mutable_relu();
    l3->set_name("condition_producing_layer");
    l3->add_input("A");
    l3->add_output("cond");
    
    auto *l4 = nnMain->add_layers();
    auto *branch_layer = l4->mutable_branch();
    l4->set_name("branch_layer");
    l4->add_input("cond");
    branch_layer->mutable_ifbranch()->CopyFrom(nnIf);
    
    Result res = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res);
    return 0;
}